

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::
     PrintValue<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>,void>
               (sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                *container,ostream *os)

{
  size_type sVar1;
  reference value;
  long lVar2;
  const_iterator __begin0;
  
  std::operator<<(os,'{');
  __begin0.pos = 0;
  sVar1 = (container->settings).table_size;
  lVar2 = 0;
  __begin0.table = container;
  while( true ) {
    if ((__begin0.table == container) && (__begin0.pos == sVar1)) {
      if (lVar2 == 0) goto LAB_006b2d0c;
      goto LAB_006b2d01;
    }
    value = google::
            const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
            ::operator*(&__begin0);
    if ((lVar2 != 0) && (std::operator<<(os,','), lVar2 == 0x20)) break;
    std::operator<<(os,' ');
    internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
    PrintValue<int,void,std::ostream&>(value,os);
    lVar2 = lVar2 + 1;
    __begin0.pos = __begin0.pos + 1;
  }
  std::operator<<(os," ...");
LAB_006b2d01:
  std::operator<<(os,' ');
LAB_006b2d0c:
  std::operator<<(os,'}');
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }